

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_queue.cpp
# Opt level: O2

void __thiscall sc_core::sc_event_queue::sc_event_queue(sc_event_queue *this,sc_module_name *name_)

{
  sc_sensitive *this_00;
  sc_simcontext *name_p;
  sc_process_handle fire_event_handle;
  sc_process_handle local_40;
  sc_process_handle local_38;
  sc_process_handle local_30;
  
  sc_interface::sc_interface((sc_interface *)this);
  this->super_sc_event_queue_if = (sc_event_queue_if)&PTR_register_port_0025cef0;
  sc_module::sc_module(&this->super_sc_module,name_);
  this->super_sc_event_queue_if = (sc_event_queue_if)&PTR_register_port_0025cd98;
  (this->super_sc_module).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_0025cde8;
  (this->super_sc_module).super_sc_process_host._vptr_sc_process_host =
       (_func_int **)&PTR__sc_event_queue_0025ce90;
  sc_ppq<sc_core::sc_time_*>::sc_ppq(&this->m_ppq,0x80,sc_time_compare);
  sc_event::sc_event(&this->m_e,0);
  this->m_change_stamp = 0;
  this->m_pending_delta = 0;
  name_p = sc_get_curr_simcontext();
  sc_simcontext::create_method_process
            ((sc_simcontext *)&fire_event_handle,(char *)name_p,true,0,(sc_process_host *)fire_event
             ,(sc_spawn_options *)0xffffffffffffff88);
  sc_process_handle::sc_process_handle(&local_30,&fire_event_handle);
  this_00 = &(this->super_sc_module).sensitive;
  sc_sensitive::operator<<(this_00,&local_30);
  sc_process_handle::~sc_process_handle(&local_30);
  sc_process_handle::sc_process_handle(&local_38,&fire_event_handle);
  sc_sensitive_pos::operator<<(&(this->super_sc_module).sensitive_pos,&local_38);
  sc_process_handle::~sc_process_handle(&local_38);
  sc_process_handle::sc_process_handle(&local_40,&fire_event_handle);
  sc_sensitive_neg::operator<<(&(this->super_sc_module).sensitive_neg,&local_40);
  sc_process_handle::~sc_process_handle(&local_40);
  sc_process_handle::~sc_process_handle(&fire_event_handle);
  sc_sensitive::operator<<(this_00,&this->m_e);
  sc_module::dont_initialize(&this->super_sc_module);
  return;
}

Assistant:

sc_event_queue::sc_event_queue( sc_module_name name_ )
    : sc_module( name_ ),
      m_ppq( 128, sc_time_compare ),
      m_e( sc_event::kernel_event ),
      m_change_stamp(0),
      m_pending_delta(0)
{
    SC_METHOD( fire_event );
    sensitive << m_e;
    dont_initialize();
}